

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priminfo_mb.h
# Opt level: O3

SetMB * __thiscall
embree::SetMB::primInfo<embree::sse2::VirtualRecalculatePrimRef>
          (SetMB *__return_storage_ptr__,SetMB *this,VirtualRecalculatePrimRef *recalculatePrimRef,
          LinearSpace3fa *space)

{
  BBox1f BVar1;
  BBox1f BVar2;
  float fVar3;
  PrimRefMB *pPVar4;
  Geometry *pGVar5;
  PrimRefVector pmVar6;
  undefined1 auVar7 [16];
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar8;
  unsigned_long uVar9;
  BBox1f BVar10;
  char cVar11;
  float fVar12;
  ulong uVar13;
  runtime_error *this_00;
  float fVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  float fVar19;
  uint uVar20;
  uint uVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  anon_class_24_3_3f686411 computePrimInfo;
  PrimInfoMB pinfo;
  task_group_context context;
  task_group_context *in_stack_fffffffffffffd18;
  SetMB *local_2a0;
  VirtualRecalculatePrimRef *local_298;
  LinearSpace3fa *local_290;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_288;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_278;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_268;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_258;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_248;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_238;
  size_t local_218;
  ulong local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  BBox1f local_1e8;
  undefined8 uStack_1e0;
  float local_1d8;
  float fStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_198;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_188;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_178;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_128;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined8 local_e4;
  undefined4 local_dc;
  code *local_d8 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_a8 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88 [4];
  ulong local_48;
  ulong local_40;
  undefined8 local_38;
  ulong uVar14;
  
  uVar17 = (this->super_PrimInfoMB).object_range._begin;
  uVar14 = (this->super_PrimInfoMB).object_range._end;
  local_168 = _DAT_01f7a9f0;
  local_158 = _DAT_01f7aa00;
  local_148 = _DAT_01f7a9f0;
  local_138 = _DAT_01f7aa00;
  local_128 = _DAT_01f7a9f0;
  local_118 = _DAT_01f7aa00;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  local_e4 = 0x3f8000003f800000;
  local_dc = 0;
  uVar13 = uVar14 - uVar17;
  local_2a0 = this;
  local_298 = recalculatePrimRef;
  local_290 = space;
  if (uVar13 < 0xc00) {
    local_248 = _DAT_01f7a9f0;
    local_238 = _DAT_01f7aa00;
    local_198 = _DAT_01f7aa00;
    local_1a8 = _DAT_01f7a9f0;
    local_1b8 = _DAT_01f7aa00;
    local_1c8 = _DAT_01f7a9f0;
    if (uVar17 < uVar14) {
      lVar18 = uVar17 * 0x50 + 0x1c;
      local_208 = 0.0;
      fStack_204 = 1.0;
      uStack_1d0 = 0;
      uStack_1cc = 0;
      fVar30 = 0.0;
      fVar24 = 1.0;
      sVar16 = 0;
      uVar17 = 0;
      do {
        pPVar4 = this->prims->items;
        local_c8[0]._0_8_ = (this->super_PrimInfoMB).time_range;
        fVar26 = *(float *)((long)pPVar4 + lVar18 + -0x10);
        fVar3 = *(float *)((long)&(pPVar4->lbounds).bounds0.lower.field_0 + lVar18);
        pGVar5 = (recalculatePrimRef->scene->geometries).items[(uint)fVar26].ptr;
        local_1d8 = local_208;
        fStack_1d4 = fStack_204;
        local_188 = local_238;
        local_178 = local_248;
        (*(pGVar5->super_RefCount)._vptr_RefCount[0x3e])
                  (&local_288,pGVar5,space,(ulong)(uint)fVar3,local_c8);
        local_1e8 = pGVar5->time_range;
        uStack_1e0 = 0;
        fVar12 = pGVar5->fnumTimeSegments;
        fVar15 = local_1e8.lower;
        local_1f8 = local_1e8.upper;
        fVar25 = local_1f8 - fVar15;
        fVar29 = (float)local_c8[0]._4_4_ - fVar15;
        fStack_1f4 = local_1f8;
        fStack_1f0 = local_1f8;
        fStack_1ec = local_1f8;
        fVar19 = floorf((((float)local_c8[0]._0_4_ - fVar15) / fVar25) * 1.0000002 * fVar12);
        fVar15 = 0.0;
        if (0.0 <= fVar19) {
          fVar15 = fVar19;
        }
        fVar19 = ceilf((fVar29 / fVar25) * 0.99999976 * fVar12);
        if (fVar12 <= fVar19) {
          fVar19 = fVar12;
        }
        fVar15 = (float)((int)fVar19 - (int)fVar15);
        fVar12 = (float)(pGVar5->numTimeSteps - 1);
        uVar14 = (ulong)(uint)fVar12;
        auVar21._0_12_ = local_278.field_1;
        auVar21._12_4_ = fVar3;
        auVar28._0_12_ = local_268.field_1;
        auVar28._12_4_ = fVar15;
        auVar27._0_12_ = local_258.field_1;
        auVar27._12_4_ = fVar12;
        local_1c8.m128 = (__m128)minps(local_1c8.m128,auVar28);
        aVar8 = local_288.field_1;
        auVar7._12_4_ = fVar26;
        auVar7._0_4_ = aVar8.x;
        auVar7._4_4_ = aVar8.y;
        auVar7._8_4_ = aVar8.z;
        local_1a8.m128 = (__m128)minps(local_1a8.m128,auVar7);
        local_1b8.m128 = (__m128)maxps(local_1b8.m128,auVar27);
        local_198.m128 = (__m128)maxps(local_198.m128,auVar21);
        auVar22._0_4_ =
             local_278.m128[0] * 0.5 + local_258.m128[0] * 0.5 +
             local_288.m128[0] * 0.5 + local_268.m128[0] * 0.5;
        auVar22._4_4_ =
             local_278.m128[1] * 0.5 + local_258.m128[1] * 0.5 +
             local_288.m128[1] * 0.5 + local_268.m128[1] * 0.5;
        auVar22._8_4_ =
             local_278.m128[2] * 0.5 + local_258.m128[2] * 0.5 +
             local_288.m128[2] * 0.5 + local_268.m128[2] * 0.5;
        auVar22._12_4_ = fVar3 * 0.5 + fVar12 * 0.5 + fVar26 * 0.5 + fVar15 * 0.5;
        local_248.m128 = (__m128)minps(local_178.m128,auVar22);
        local_238.m128 = (__m128)maxps(local_188.m128,auVar22);
        if (local_1e8.lower <= fVar24) {
          fVar24 = local_1e8.lower;
        }
        fVar12 = local_1f8;
        if (local_1f8 <= fVar30) {
          fVar12 = fVar30;
        }
        fVar30 = fVar12;
        sVar16 = sVar16 + (uint)fVar15;
        uVar20 = (int)((uint)(uVar17 < uVar14) << 0x1f) >> 0x1f;
        uVar23 = (int)((uint)(uVar17 < uVar14) << 0x1f) >> 0x1f;
        local_208 = (float)(~uVar20 & (uint)local_1d8 | (uint)local_1e8.lower & uVar20);
        fStack_204 = (float)(~uVar23 & (uint)fStack_1d4 | (uint)local_1e8.upper & uVar23);
        if (uVar17 <= uVar14) {
          uVar17 = uVar14;
        }
        lVar18 = lVar18 + 0x50;
        uVar13 = uVar13 - 1;
        local_218 = sVar16;
        local_210 = uVar17;
        fStack_200 = fVar24;
        fStack_1fc = fVar30;
      } while (uVar13 != 0);
    }
    else {
      local_208 = 0.0;
      fStack_204 = 1.0;
      local_218 = 0;
      local_210 = 0;
      fStack_200 = 1.0;
      fStack_1fc = 0.0;
    }
  }
  else {
    local_c8[0]._12_2_ = 0x401;
    local_a8[0]._0_8_ = 0;
    local_a8[0]._8_8_ = 0;
    local_88[0]._0_8_ = 8;
    tbb::detail::r1::initialize((task_group_context *)&local_c8[0].field_1);
    local_38 = 0x400;
    local_d8[0] = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
    local_d8[1] = (code *)&local_2a0;
    local_48 = uVar14;
    local_40 = uVar17;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::SetMB::primInfo<embree::sse2::VirtualRecalculatePrimRef>(embree::sse2::VirtualRecalculatePrimRef_const&,embree::LinearSpace3<embree::Vec3fa>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::SetMB::primInfo<embree::sse2::VirtualRecalculatePrimRef>(embree::sse2::VirtualRecalculatePrimRef_const&,embree::LinearSpace3<embree::Vec3fa>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_288.field_1,(d1 *)&local_48,
               (blocked_range<unsigned_long> *)&local_168.field_1,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_d8,
               (anon_class_16_2_ed117de8_conflict17 *)
               PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
               (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                *)local_c8,in_stack_fffffffffffffd18);
    cVar11 = tbb::detail::r1::is_group_execution_cancelled
                       ((task_group_context *)&local_c8[0].field_1);
    if (cVar11 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&local_c8[0].field_1);
    local_198 = local_278;
    local_1a8 = local_288;
    local_1b8 = local_258;
    local_1c8 = local_268;
  }
  pmVar6 = this->prims;
  BVar1 = (this->super_PrimInfoMB).time_range;
  (__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.lower.field_0 = local_1a8;
  (__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds0.upper.field_0 = local_198;
  (__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.lower.field_0 = local_1c8;
  (__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  geomBounds.bounds1.upper.field_0 = local_1b8;
  (__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.lower.field_0 = local_248;
  (__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
  centBounds.upper.field_0 = local_238;
  BVar2.upper = fStack_204;
  BVar2.lower = local_208;
  BVar10.upper = fStack_1fc;
  BVar10.lower = fStack_200;
  (__return_storage_ptr__->super_PrimInfoMB).num_time_segments = local_218;
  (__return_storage_ptr__->super_PrimInfoMB).max_num_time_segments = local_210;
  (__return_storage_ptr__->super_PrimInfoMB).max_time_range = BVar2;
  (__return_storage_ptr__->super_PrimInfoMB).time_range = BVar10;
  __return_storage_ptr__->prims = pmVar6;
  uVar9 = (this->super_PrimInfoMB).object_range._end;
  (__return_storage_ptr__->super_PrimInfoMB).object_range._begin =
       (this->super_PrimInfoMB).object_range._begin;
  (__return_storage_ptr__->super_PrimInfoMB).object_range._end = uVar9;
  BVar2 = (__return_storage_ptr__->super_PrimInfoMB).time_range;
  fVar12 = BVar2.lower;
  fVar26 = BVar2.upper;
  fVar24 = BVar1.lower;
  fVar30 = BVar1.upper;
  uVar20 = -(uint)(fVar12 < fVar24);
  uVar23 = -(uint)(fVar26 < fVar30);
  (__return_storage_ptr__->super_PrimInfoMB).time_range =
       (BBox1f)(CONCAT44(~uVar23 & (uint)fVar30,~uVar20 & (uint)fVar12) |
               CONCAT44((uint)fVar26 & uVar23,(uint)fVar24 & uVar20));
  return __return_storage_ptr__;
}

Assistant:

const SetMB primInfo(const RecalculatePrimRef& recalculatePrimRef, const LinearSpace3fa& space) const
      {
        auto computePrimInfo = [&](const range<size_t>& r) -> PrimInfoMB
        {
          PrimInfoMB pinfo(empty);
          for (size_t j=r.begin(); j<r.end(); j++)
          {
            PrimRefMB& ref = (*prims)[j];
            PrimRefMB ref1 = recalculatePrimRef(ref,time_range,space);
            pinfo.add_primref(ref1);
          };
          return pinfo;
        };
        
        const PrimInfoMB pinfo = parallel_reduce(object_range.begin(), object_range.end(), PARALLEL_FIND_BLOCK_SIZE, PARALLEL_THRESHOLD, 
                                                 PrimInfoMB(empty), computePrimInfo, PrimInfoMB::merge2);

        return SetMB(pinfo,prims,object_range,time_range);
      }